

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsNodeID.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::CommunicationsNodeID::Decode(CommunicationsNodeID *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  CommunicationsNodeID *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  EntityIdentifier::Decode(&this->super_EntityIdentifier,local_18);
  KDataStream::operator>>
            (local_18,(unsigned_short *)
                      &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
  return;
}

Assistant:

void CommunicationsNodeID::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < COMMUNICATIONS_NODE_ID_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    EntityIdentifier::Decode( stream );
    stream >> m_ui16ElementID;
}